

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squtils.h
# Opt level: O3

void __thiscall
sqvector<long_long>::resize(sqvector<long_long> *this,SQUnsignedInteger newsize,longlong *fill)

{
  longlong *plVar1;
  ulong uVar2;
  
  if (this->_allocated < newsize) {
    plVar1 = (longlong *)sq_vm_realloc(this->_vals,this->_allocated << 3,newsize * 8);
    this->_vals = plVar1;
    this->_allocated = newsize;
  }
  uVar2 = this->_size;
  if (uVar2 < newsize) {
    plVar1 = this->_vals;
    do {
      plVar1[uVar2] = *fill;
      uVar2 = this->_size + 1;
      this->_size = uVar2;
    } while (uVar2 < newsize);
  }
  else {
    this->_size = newsize;
  }
  return;
}

Assistant:

void resize(SQUnsignedInteger newsize, const T& fill = T())
    {
        if(newsize > _allocated)
            _realloc(newsize);
        if(newsize > _size) {
            while(_size < newsize) {
                new ((void *)&_vals[_size]) T(fill);
                _size++;
            }
        }
        else{
            for(SQUnsignedInteger i = newsize; i < _size; i++) {
                _vals[i].~T();
            }
            _size = newsize;
        }
    }